

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O0

MPP_RET mpp_dec_control_normal(MppDecImpl *dec,MpiCmd cmd,void *param)

{
  MPP_RET MVar1;
  Mutex *mutex;
  undefined1 local_38 [8];
  AutoMutex auto_lock;
  MPP_RET ret;
  void *param_local;
  MpiCmd cmd_local;
  MppDecImpl *dec_local;
  
  auto_lock.mLock._4_4_ = MPP_OK;
  mutex = MppMutexCond::mutex(dec->cmd_lock);
  Mutex::Autolock::Autolock((Autolock *)local_38,mutex,1);
  dec->cmd = cmd;
  dec->param = param;
  dec->cmd_ret = (MPP_RET *)((long)&auto_lock.mLock + 4);
  dec->cmd_send = dec->cmd_send + 1;
  if ((mpp_dec_debug & 0x20) != 0) {
    _mpp_log_l(4,"mpp_dec","detail: %p control cmd %08x param %p start disable_thread %d \n",
               "mpp_dec_control_normal",dec,(ulong)cmd,param,(dec->cfg).base.disable_thread);
  }
  mpp_dec_notify_normal(dec,0x10000);
  sem_post((sem_t *)&dec->cmd_start);
  sem_wait((sem_t *)&dec->cmd_done);
  MVar1 = auto_lock.mLock._4_4_;
  Mutex::Autolock::~Autolock((Autolock *)local_38);
  return MVar1;
}

Assistant:

MPP_RET mpp_dec_control_normal(MppDecImpl *dec, MpiCmd cmd, void *param)
{
    MPP_RET ret = MPP_OK;
    AutoMutex auto_lock(dec->cmd_lock->mutex());

    dec->cmd = cmd;
    dec->param = param;
    dec->cmd_ret = &ret;
    dec->cmd_send++;

    dec_dbg_detail("detail: %p control cmd %08x param %p start disable_thread %d \n",
                   dec, cmd, param, dec->cfg.base.disable_thread);

    mpp_dec_notify_normal(dec, MPP_DEC_CONTROL);
    sem_post(&dec->cmd_start);
    sem_wait(&dec->cmd_done);

    return ret;
}